

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_validateSequence
                 (U32 offCode,U32 matchLength,U32 minMatch,size_t posInSrc,U32 windowLog,
                 size_t dictSize,int useSequenceProducer)

{
  uint uVar1;
  ulong local_58;
  size_t matchLenLowerBound;
  size_t offsetBound;
  U32 windowSize;
  size_t dictSize_local;
  U32 windowLog_local;
  size_t posInSrc_local;
  U32 minMatch_local;
  U32 matchLength_local;
  U32 offCode_local;
  
  uVar1 = 1 << ((byte)windowLog & 0x1f);
  if (uVar1 < posInSrc) {
    local_58 = (ulong)uVar1;
  }
  else {
    local_58 = posInSrc + dictSize;
  }
  uVar1 = 4;
  if (minMatch == 3 || useSequenceProducer != 0) {
    uVar1 = 3;
  }
  if (local_58 != 0) {
    if (local_58 + 3 < (ulong)offCode) {
      _matchLength_local = 0xffffffffffffff95;
    }
    else if (matchLength < uVar1) {
      _matchLength_local = 0xffffffffffffff95;
    }
    else {
      _matchLength_local = 0;
    }
    return _matchLength_local;
  }
  __assert_fail("(offsetBound)>0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                ,0x18e1,"size_t ZSTD_validateSequence(U32, U32, U32, size_t, U32, size_t, int)");
}

Assistant:

static size_t
ZSTD_validateSequence(U32 offCode, U32 matchLength, U32 minMatch,
                      size_t posInSrc, U32 windowLog, size_t dictSize, int useSequenceProducer)
{
    U32 const windowSize = 1u << windowLog;
    /* posInSrc represents the amount of data the decoder would decode up to this point.
     * As long as the amount of data decoded is less than or equal to window size, offsets may be
     * larger than the total length of output decoded in order to reference the dict, even larger than
     * window size. After output surpasses windowSize, we're limited to windowSize offsets again.
     */
    size_t const offsetBound = posInSrc > windowSize ? (size_t)windowSize : posInSrc + (size_t)dictSize;
    size_t const matchLenLowerBound = (minMatch == 3 || useSequenceProducer) ? 3 : 4;
    RETURN_ERROR_IF(offCode > OFFSET_TO_OFFBASE(offsetBound), externalSequences_invalid, "Offset too large!");
    /* Validate maxNbSeq is large enough for the given matchLength and minMatch */
    RETURN_ERROR_IF(matchLength < matchLenLowerBound, externalSequences_invalid, "Matchlength too small for the minMatch");
    return 0;
}